

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O0

QcShmQue * shm_queue_find(QcShm *qcShm,char *que_name,QcErr *err)

{
  int iVar1;
  char *pcVar2;
  QcSem *pQVar3;
  QcShmQue *shmQue;
  P_ShmQue *p_shmQue;
  off_t offset;
  QcErr *err_local;
  char *que_name_local;
  QcShm *qcShm_local;
  
  pcVar2 = qc_shm_getaddr(qcShm);
  shmQue = (QcShmQue *)(pcVar2 + 8);
  while( true ) {
    iVar1 = strcmp((char *)shmQue,que_name);
    if (iVar1 == 0) {
      qcShm_local = (QcShm *)malloc(0x20);
      *(QcShmQue **)(qcShm_local->name + 8) = shmQue;
      pQVar3 = qc_sem_open((char *)((long)&shmQue[1].p_shmQue + 4),err);
      *(QcSem **)(qcShm_local->name + 0x10) = pQVar3;
      if (*(long *)(qcShm_local->name + 0x10) == 0) {
        free(qcShm_local);
        qcShm_local = (QcShm *)0x0;
      }
      else {
        pQVar3 = qc_sem_open((char *)((long)&shmQue[5].p_shmQue + 4),err);
        *(QcSem **)(qcShm_local->name + 0x18) = pQVar3;
        if (*(long *)(qcShm_local->name + 0x18) == 0) {
          qc_sem_destroy(*(QcSem **)(qcShm_local->name + 0x10));
          free(qcShm_local);
          qcShm_local = (QcShm *)0x0;
        }
        else {
          *(QcShm **)qcShm_local->name = qcShm;
        }
      }
      return (QcShmQue *)qcShm_local;
    }
    if (*(long *)((long)&shmQue[0xb].qcShm + 4) == -1) break;
    pcVar2 = qc_shm_getaddr(qcShm);
    shmQue = (QcShmQue *)(pcVar2 + *(long *)((long)&shmQue[0xb].qcShm + 4));
  }
  qc_seterr(err,-1,"que_name (%s) not found in shm.",que_name);
  return (QcShmQue *)0x0;
}

Assistant:

QcShmQue* shm_queue_find(QcShm *qcShm, const char *que_name, QcErr *err)
{
    off_t offset;
    P_ShmQue *p_shmQue;

    offset = sizeof(P_Shmem);
    p_shmQue = (P_ShmQue*)(qc_shm_getaddr(qcShm) + offset);

    while(1)
    {
        if(strcmp(p_shmQue->quename, que_name) == 0)
        {
            QcShmQue* shmQue = malloc(sizeof(QcShmQue));
            shmQue->p_shmQue = p_shmQue;

            shmQue->sem_que = qc_sem_open(p_shmQue->semname_que, err);
            if (NULL == shmQue->sem_que)
            {
                free(shmQue);
                return NULL;
            }

            shmQue->sem_lst = qc_sem_open(p_shmQue->semname_lst, err);
            if (NULL == shmQue->sem_lst)
            {
                qc_sem_destroy(shmQue->sem_que);
                free(shmQue);
                return NULL;
            }

            shmQue->qcShm = qcShm;
            return shmQue;
        }

        if(-1 == p_shmQue->next_offset)
        {
            qc_seterr(err, -1, "que_name (%s) not found in shm.", que_name);
            return NULL;
        }

        p_shmQue = (P_ShmQue*)((char*)qc_shm_getaddr(qcShm) + p_shmQue->next_offset);
    }
}